

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sys_lnx_UdevEnumerate.h
# Opt level: O0

bool __thiscall axl::sys::lnx::UdevEnumerate::create(UdevEnumerate *this,udev *ctx)

{
  bool bVar1;
  Handle<axl::sys::lnx::libudev::udev_enumerate_*,_axl::sys::lnx::UnrefUdevEnumerate,_axl::sl::Zero<axl::sys::lnx::libudev::udev_enumerate_*>_>
  *in_RSI;
  udev_enumerate *in_RDI;
  
  (*(code *)libudev::udev_enumerate_new)(in_RSI);
  sl::
  Handle<axl::sys::lnx::libudev::udev_enumerate_*,_axl::sys::lnx::UnrefUdevEnumerate,_axl::sl::Zero<axl::sys::lnx::libudev::udev_enumerate_*>_>
  ::attach(in_RSI,in_RDI);
  bVar1 = completeUdev(SUB81((ulong)in_RSI >> 0x38,0),(char *)in_RDI);
  return bVar1;
}

Assistant:

bool
	create(udev* ctx) {
		attach(udev_enumerate_new(ctx));
		return completeUdev(m_h, "udev_enumerate_new");
	}